

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int unixShmUnmap(sqlite3_file *fd,int deleteFlag)

{
  int *piVar1;
  sqlite3_io_methods *p;
  long lVar2;
  sqlite3_io_methods *psVar3;
  _func_int_sqlite3_file_ptr **pp_Var4;
  sqlite3_mutex *psVar5;
  _func_int_sqlite3_file_ptr **pp_Var6;
  
  p = fd[8].pMethods;
  if (p != (sqlite3_io_methods *)0x0) {
    lVar2 = *(long *)p;
    if (*(sqlite3_mutex **)(lVar2 + 8) != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(*(sqlite3_mutex **)(lVar2 + 8));
    }
    pp_Var4 = (_func_int_sqlite3_file_ptr **)(lVar2 + 0x38);
    do {
      pp_Var6 = pp_Var4;
      psVar3 = (sqlite3_io_methods *)*pp_Var6;
      pp_Var4 = &psVar3->xClose;
    } while (psVar3 != p);
    *pp_Var6 = p->xClose;
    sqlite3_free(p);
    fd[8].pMethods = (sqlite3_io_methods *)0x0;
    if (*(sqlite3_mutex **)(lVar2 + 8) != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(*(sqlite3_mutex **)(lVar2 + 8));
    }
    if (sqlite3Config.bCoreMutex != 0) {
      psVar5 = (*sqlite3Config.mutex.xMutexAlloc)(0xb);
      if (psVar5 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(psVar5);
      }
    }
    piVar1 = (int *)(lVar2 + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      if ((deleteFlag != 0) && (-1 < *(int *)(lVar2 + 0x18))) {
        (*aSyscall[0x10].pCurrent)(*(undefined8 *)(lVar2 + 0x10));
      }
      unixShmPurge((unixFile *)fd);
    }
    if (sqlite3Config.bCoreMutex != 0) {
      psVar5 = (*sqlite3Config.mutex.xMutexAlloc)(0xb);
      if (psVar5 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar5);
      }
    }
  }
  return 0;
}

Assistant:

static int unixShmUnmap(
  sqlite3_file *fd,               /* The underlying database file */
  int deleteFlag                  /* Delete shared-memory if true */
){
  unixShm *p;                     /* The connection to be closed */
  unixShmNode *pShmNode;          /* The underlying shared-memory file */
  unixShm **pp;                   /* For looping over sibling connections */
  unixFile *pDbFd;                /* The underlying database file */

  pDbFd = (unixFile*)fd;
  p = pDbFd->pShm;
  if( p==0 ) return SQLITE_OK;
  pShmNode = p->pShmNode;

  assert( pShmNode==pDbFd->pInode->pShmNode );
  assert( pShmNode->pInode==pDbFd->pInode );

  /* Remove connection p from the set of connections associated
  ** with pShmNode */
  sqlite3_mutex_enter(pShmNode->mutex);
  for(pp=&pShmNode->pFirst; (*pp)!=p; pp = &(*pp)->pNext){}
  *pp = p->pNext;

  /* Free the connection p */
  sqlite3_free(p);
  pDbFd->pShm = 0;
  sqlite3_mutex_leave(pShmNode->mutex);

  /* If pShmNode->nRef has reached 0, then close the underlying
  ** shared-memory file, too */
  unixEnterMutex();
  assert( pShmNode->nRef>0 );
  pShmNode->nRef--;
  if( pShmNode->nRef==0 ){
    if( deleteFlag && pShmNode->h>=0 ){
      osUnlink(pShmNode->zFilename);
    }
    unixShmPurge(pDbFd);
  }
  unixLeaveMutex();

  return SQLITE_OK;
}